

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSpan.h
# Opt level: O0

string * __thiscall
libsgp4::TimeSpan::ToString_abi_cxx11_(string *__return_storage_ptr__,TimeSpan *this)

{
  _Setfill<char> _Var1;
  int iVar2;
  _Setw _Var3;
  undefined8 uVar4;
  ostream *poVar5;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  TimeSpan *local_18;
  TimeSpan *this_local;
  
  local_18 = this;
  this_local = (TimeSpan *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  uVar4 = std::ostream::operator<<(local_190,std::right);
  _Var1 = std::setfill<char>('0');
  std::operator<<(uVar4,_Var1._M_c);
  if (this->m_ticks < 0) {
    std::operator<<(local_190,'-');
  }
  iVar2 = Days(this);
  if (iVar2 != 0) {
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(local_190,_Var3);
    iVar2 = Days(this);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    std::operator<<(poVar5,'.');
  }
  _Var3 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var3);
  iVar2 = Hours(this);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  std::operator<<(poVar5,':');
  _Var3 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var3);
  iVar2 = Minutes(this);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  std::operator<<(poVar5,':');
  _Var3 = std::setw(2);
  poVar5 = std::operator<<(local_190,_Var3);
  iVar2 = Seconds(this);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  std::ostream::operator<<(poVar5,iVar2);
  iVar2 = Microseconds(this);
  if (iVar2 != 0) {
    poVar5 = std::operator<<(local_190,'.');
    _Var3 = std::setw(6);
    poVar5 = std::operator<<(poVar5,_Var3);
    iVar2 = Microseconds(this);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    std::ostream::operator<<(poVar5,iVar2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;

        ss << std::right << std::setfill('0');
        
        if (m_ticks < 0)
        {
            ss << '-';
        }

        if (Days() != 0)
        {
            ss << std::setw(2) << std::abs(Days()) << '.';
        }

        ss << std::setw(2) << std::abs(Hours()) << ':';
        ss << std::setw(2) << std::abs(Minutes()) << ':';
        ss << std::setw(2) << std::abs(Seconds());

        if (Microseconds() != 0)
        {
            ss << '.' << std::setw(6) << std::abs(Microseconds());
        }

        return ss.str();
    }